

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  bool bVar1;
  int *piVar2;
  uint *puVar3;
  stbi_uc sVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  stbi__uint32 sVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  char *__nptr;
  stbi__context *psVar13;
  undefined1 local_48b8 [8];
  stbi__jpeg j;
  char *local_60;
  int *local_58;
  uint *local_50;
  int *local_48;
  stbi__context *local_40;
  stbi_uc local_31;
  
  local_48b8 = (undefined1  [8])s;
  iVar7 = stbi__decode_jpeg_header((stbi__jpeg *)local_48b8,2);
  if (iVar7 != 0) {
LAB_001103b1:
    if (x != (int *)0x0) {
      *x = *(stbi__uint32 *)local_48b8;
    }
    if (y != (int *)0x0) {
      *y = *(stbi__uint32 *)((long)local_48b8 + 4);
    }
    if (comp != (int *)0x0) {
      *comp = *(int *)((long)local_48b8 + 8);
    }
    return 1;
  }
  *(stbi_uc **)((long)local_48b8 + 0xb8) = *(stbi_uc **)((long)local_48b8 + 200);
  local_48b8 = (undefined1  [8])s;
  iVar7 = stbi__parse_png_file((stbi__png *)local_48b8,2,0);
  if (iVar7 != 0) goto LAB_001103b1;
  *(stbi_uc **)((long)local_48b8 + 0xb8) = *(stbi_uc **)((long)local_48b8 + 200);
  iVar7 = stbi__gif_header(s,(stbi__gif *)local_48b8,comp,1);
  if (iVar7 != 0) {
    if (x != (int *)0x0) {
      *x = local_48b8._0_4_;
    }
    if (y != (int *)0x0) {
      *y = local_48b8._4_4_;
      return 1;
    }
    return 1;
  }
  s->img_buffer = s->img_buffer_original;
  sVar4 = stbi__get8(s);
  if ((sVar4 == 'B') && (sVar4 = stbi__get8(s), sVar4 == 'M')) {
    stbi__skip(s,0xc);
    sVar8 = stbi__get32le(s);
    if ((sVar8 == 0x7c) || (((sVar8 == 0x28 || (sVar8 == 0x38)) || (sVar8 == 0x6c)))) {
      sVar8 = stbi__get32le(s);
      *x = sVar8;
      sVar8 = stbi__get32le(s);
    }
    else {
      if (sVar8 != 0xc) goto LAB_001104ea;
      iVar7 = stbi__get16le(s);
      *x = iVar7;
      sVar8 = stbi__get16le(s);
    }
    *y = sVar8;
    iVar7 = stbi__get16le(s);
    if (iVar7 == 1) {
      uVar9 = stbi__get16le(s);
      *comp = uVar9 >> 3;
      return 1;
    }
  }
LAB_001104ea:
  s->img_buffer = s->img_buffer_original;
  sVar8 = stbi__get32be(s);
  if ((sVar8 == 0x38425053) && (iVar7 = stbi__get16be(s), iVar7 == 1)) {
    stbi__skip(s,6);
    uVar9 = stbi__get16be(s);
    if (uVar9 < 0x11) {
      sVar8 = stbi__get32be(s);
      *y = sVar8;
      sVar8 = stbi__get32be(s);
      *x = sVar8;
      iVar7 = stbi__get16be(s);
      if ((iVar7 == 8) && (iVar7 = stbi__get16be(s), iVar7 == 3)) {
        *comp = 4;
        return 1;
      }
    }
  }
  s->img_buffer = s->img_buffer_original;
  local_50 = (uint *)comp;
  stbi__skip(s,0x5c);
  iVar7 = stbi__get16be(s);
  *x = iVar7;
  local_48 = x;
  iVar7 = stbi__get16be(s);
  *y = iVar7;
  local_58 = y;
  local_40 = s;
  iVar7 = stbi__at_eof(s);
  if (iVar7 == 0) {
    if ((*local_48 == 0) || (*local_58 <= (int)(0x10000000 / (long)*local_48))) {
      stbi__skip(local_40,8);
      psVar13 = local_40;
      bVar5 = 0;
      iVar7 = 0xb;
      while (iVar7 = iVar7 + -1, iVar7 != 0) {
        local_31 = stbi__get8(psVar13);
        sVar4 = stbi__get8(psVar13);
        stbi__get8(psVar13);
        bVar6 = stbi__get8(psVar13);
        iVar10 = stbi__at_eof(psVar13);
        if ((iVar10 != 0) || (sVar4 != '\b')) goto LAB_001105d5;
        bVar5 = bVar5 | bVar6;
        if (local_31 == '\0') {
          *local_50 = 4 - ((bVar5 & 0x10) == 0);
          return 1;
        }
      }
    }
    else {
LAB_001105d5:
      local_40->img_buffer = local_40->img_buffer_original;
    }
  }
  psVar13 = local_40;
  puVar3 = local_50;
  piVar2 = local_58;
  iVar7 = stbi__pnm_info(local_40,local_48,local_58,(int *)local_50);
  if (iVar7 != 0) {
    return 1;
  }
  stbi__hdr_gettoken(psVar13,local_48b8);
  iVar7 = bcmp(local_48b8,"#?RADIANCE",0xb);
  if (iVar7 == 0) {
    bVar1 = false;
    while( true ) {
      stbi__hdr_gettoken(local_40,local_48b8);
      psVar13 = local_40;
      if (local_48b8[0] == '\0') break;
      iVar7 = bcmp(local_48b8,"FORMAT=32-bit_rle_rgbe",0x17);
      if (iVar7 == 0) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      stbi__hdr_gettoken(local_40,local_48b8);
      iVar7 = bcmp(local_48b8,"-Y ",3);
      if (iVar7 == 0) {
        local_60 = local_48b8 + 3;
        lVar11 = strtol(local_60,&local_60,10);
        *piVar2 = (int)lVar11;
        __nptr = local_60 + 2;
        do {
          pcVar12 = __nptr;
          __nptr = pcVar12 + 1;
        } while (pcVar12[-2] == ' ');
        psVar13 = local_40;
        if (((pcVar12[-2] == '+') && (pcVar12[-1] == 'X')) && (*pcVar12 == ' ')) {
          local_60 = __nptr;
          lVar11 = strtol(__nptr,(char **)0x0,10);
          *local_48 = (int)lVar11;
          *puVar3 = 3;
          return 1;
        }
      }
    }
  }
  psVar13->img_buffer = psVar13->img_buffer_original;
  stbi__get8(psVar13);
  bVar5 = stbi__get8(psVar13);
  if (bVar5 < 2) {
    bVar5 = stbi__get8(psVar13);
    if ((byte)((bVar5 & 0xf7) - 4) < 0xfd) goto LAB_00110711;
    stbi__skip(psVar13,9);
    iVar7 = stbi__get16le(psVar13);
    if (((iVar7 != 0) && (iVar10 = stbi__get16le(psVar13), iVar10 != 0)) &&
       (bVar5 = stbi__get8(psVar13), (byte)(bVar5 << 5 | (byte)(bVar5 - 8) >> 3) < 4)) {
      *local_48 = iVar7;
      *piVar2 = iVar10;
      if (puVar3 == (uint *)0x0) {
        return 1;
      }
      *puVar3 = (uint)(bVar5 >> 3);
      return 1;
    }
  }
  psVar13->img_buffer = psVar13->img_buffer_original;
LAB_00110711:
  stbi__g_failure_reason = "unknown image type";
  return 0;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}